

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall argo::json::copy_construct_object(json *this,json_object *o)

{
  __uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> this_00;
  _Base_ptr p_Var1;
  __uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>
  local_68;
  insert_iterator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>_>
  local_40;
  
  *(undefined4 *)((long)&this->m_value + 8) = 0;
  (this->m_value).u_array.
  super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.iter._M_node = (_Base_ptr)((long)&this->m_value + 8);
  *(_Base_ptr *)((long)&this->m_value + 0x18) = local_40.iter._M_node;
  *(_Base_ptr *)((long)&this->m_value + 0x20) = local_40.iter._M_node;
  *(undefined8 *)((long)&this->m_value + 0x28) = 0;
  local_40.container =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
        *)&this->m_value;
  for (p_Var1 = (o->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(o->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
    super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
         (tuple<argo::json_*,_std::default_delete<argo::json>_>)operator_new(0x58);
    json((json *)this_00._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                 .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,*(json **)(p_Var1 + 2));
    local_70._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
    super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
         this_00._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_68,(string *)(p_Var1 + 1));
    local_68.second._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
    super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
    super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         local_70._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
    local_70._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
    super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
         (tuple<argo::json_*,_std::default_delete<argo::json>_>)
         (_Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>)0x0;
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
              ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_70);
    std::
    insert_iterator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>_>
    ::operator=(&local_40,&local_68);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>
    ::~pair(&local_68);
  }
  return;
}

Assistant:

json::json(const json &other) : m_type(null_e)
{
    copy_json(other);
}